

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v7::vprint<char>
               (basic_ostream<char,_std::char_traits<char>_> *os,basic_string_view<char> format_str,
               basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               args)

{
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_string_view<char> format_str_00;
  locale_ref local_290;
  unsigned_long_long local_288;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aStack_280;
  char *local_278;
  size_t sStack_270;
  allocator<char> local_249;
  undefined1 local_248 [8];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_local;
  basic_string_view<char> format_str_local;
  
  buffer._528_8_ = os;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,&local_249);
  std::allocator<char>::~allocator(&local_249);
  local_288 = args.desc_;
  aStack_280 = args.field_1;
  local_278 = format_str.data_;
  sStack_270 = format_str.size_;
  detail::locale_ref::locale_ref(&local_290);
  format_str_00.size_ = sStack_270;
  format_str_00.data_ = local_278;
  args_00.field_1.args_ = aStack_280.args_;
  args_00.desc_ = local_288;
  detail::vformat_to<char>((buffer<char> *)local_248,format_str_00,args_00,local_290);
  detail::write_buffer<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)buffer._528_8_,
             (buffer<char> *)local_248);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248);
  return;
}

Assistant:

void vprint(std::basic_ostream<Char>& os, basic_string_view<Char> format_str,
            basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  basic_memory_buffer<Char> buffer;
  detail::vformat_to(buffer, format_str, args);
  detail::write_buffer(os, buffer);
}